

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_string_vector(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_attr_chlist_entry_t *peVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int local_44;
  exr_attribute_t *local_40;
  undefined4 local_34;
  
  lVar4 = (long)((a->field_6).chlist)->num_channels;
  local_40 = a;
  if (lVar4 < 1) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (long)*(int *)(((a->field_6).chlist)->entries->reserved + lVar5 + -0x15) + 4;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 * 0x10 != lVar5);
    if (uVar3 >> 0x1f != 0) {
      iVar2 = (*ctxt->standard_error)(ctxt,3);
      goto LAB_0012039f;
    }
  }
  local_34 = (undefined4)uVar3;
  iVar2 = (*ctxt->do_write)(ctxt,&local_34,4,&ctxt->output_file_offset);
LAB_0012039f:
  if (iVar2 == 0) {
    lVar5 = -1;
    lVar4 = 0;
    do {
      lVar5 = lVar5 + 1;
      if (((local_40->field_6).chlist)->num_channels <= lVar5) {
        return 0;
      }
      peVar1 = ((local_40->field_6).chlist)->entries;
      if (*(int *)(peVar1->reserved + lVar4 + -0x15) < 0) {
        iVar2 = (*ctxt->standard_error)(ctxt,3);
      }
      else {
        local_44 = *(int *)(peVar1->reserved + lVar4 + -0x15);
        iVar2 = (*ctxt->do_write)(ctxt,&local_44,4,&ctxt->output_file_offset);
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = (*ctxt->do_write)(ctxt,*(void **)(peVar1->reserved + lVar4 + -0xd),
                                (long)*(int *)(peVar1->reserved + lVar4 + -0x15),
                                &ctxt->output_file_offset);
      lVar4 = lVar4 + 0x10;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

static exr_result_t
save_string_vector (
    struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    size_t       attrsz = 0;

    for (int i = 0; i < a->stringvector->n_strings; ++i)
    {
        attrsz += sizeof (int32_t);
        attrsz += (size_t) a->stringvector->strings[i].length;
    }

    rv = save_attr_sz (ctxt, attrsz);

    for (int i = 0; rv == EXR_ERR_SUCCESS && i < a->stringvector->n_strings;
         ++i)
    {
        const exr_attr_string_t* s = a->stringvector->strings + i;

        rv = save_attr_sz (ctxt, (size_t) s->length);
        if (rv == EXR_ERR_SUCCESS)
            rv = ctxt->do_write (
                ctxt,
                s->str,
                (uint64_t) s->length,
                &(ctxt->output_file_offset));
    }

    return rv;
}